

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

QList<QByteArray> * __thiscall QObject::dynamicPropertyNames(QObject *this)

{
  QObjectPrivate *pQVar1;
  QList<QByteArray> *in_RDI;
  QObjectPrivate *d;
  QList<QByteArray> *this_00;
  
  this_00 = in_RDI;
  pQVar1 = d_func((QObject *)0x3f8088);
  if (pQVar1->extraData == (ExtraData *)0x0) {
    memset(in_RDI,0,0x18);
    QList<QByteArray>::QList((QList<QByteArray> *)0x3f80c6);
  }
  else {
    QList<QByteArray>::QList(this_00,in_RDI);
  }
  return this_00;
}

Assistant:

QList<QByteArray> QObject::dynamicPropertyNames() const
{
    Q_D(const QObject);
    if (d->extraData)
        return d->extraData->propertyNames;
    return QList<QByteArray>();
}